

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O2

sc_signed * sc_dt::operator*(sc_signed *__return_storage_ptr__,sc_unsigned *u,long v)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  sc_digit vd [3];
  
  iVar1 = u->sgn;
  if (v < 1) {
    if (v == 0) goto LAB_001d53b6;
    bVar2 = (ulong)v < 0x8000000000000001;
    v = -v;
    if (bVar2) {
      v = 0x8000000000000000;
    }
    iVar3 = -1;
  }
  else {
    iVar3 = 1;
  }
  if (iVar1 != 0) {
    from_uint<unsigned_long>(3,vd,v);
    mul_signed_friend(__return_storage_ptr__,(uint)(iVar1 == iVar3) * 2 + -1,u->nbits,u->ndigits,
                      u->digit,0x40,3,vd);
    return __return_storage_ptr__;
  }
LAB_001d53b6:
  sc_length_param::sc_length_param((sc_length_param *)vd);
  sc_signed::sc_signed(__return_storage_ptr__,vd[0]);
  return __return_storage_ptr__;
}

Assistant:

sc_signed
operator*(const sc_unsigned& u, long v)
{

  small_type s = mul_signs(u.sgn, get_sign(v));

  if (s == SC_ZERO) // case 1
    return sc_signed();

  CONVERT_LONG_2(v);

  // cases 2-4
  return mul_signed_friend(s, u.nbits, u.ndigits, u.digit,
                           BITS_PER_ULONG, DIGITS_PER_ULONG, vd);

}